

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VWSqrSumMaskLocal(N_Vector X,N_Vector W,N_Vector ID,sunindextype local_length,int myid)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  uint in_R8D;
  N_Vector X_00;
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype wval;
  sunrealtype xval;
  sunrealtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunindextype in_stack_ffffffffffffff78;
  N_Vector in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  double dVar5;
  double dVar6;
  int local_28;
  
  local_28 = 0;
  if (0.0 < (double)(int)in_R8D) {
    dVar6 = sqrt((double)(int)in_R8D);
  }
  else {
    dVar6 = 0.0;
  }
  if (0.0 < (double)(in_RCX + -1)) {
    dVar5 = sqrt((double)(in_RCX + -1));
  }
  else {
    dVar5 = 0.0;
  }
  X_00 = (N_Vector)(1.0 / dVar5);
  set_element_range(X_00,(sunindextype)dVar6,(sunindextype)dVar5,
                    (sunrealtype)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  set_element_range(X_00,(sunindextype)dVar6,(sunindextype)dVar5,
                    (sunrealtype)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  N_VConst(0x3ff0000000000000,in_RDX);
  set_element(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,5.47931646944734e-318);
  dVar6 = get_time();
  dVar5 = (double)N_VWSqrSumMaskLocal(in_RDI,in_RSI,in_RDX);
  sync_device(in_RDI);
  dVar1 = get_time();
  if (0.0 <= dVar5) {
    dVar2 = (double)(int)in_R8D;
    dVar3 = sqrt(2.220446049250313e-16);
    iVar4 = SUNRCompareTol(dVar5,dVar2,SUB84(dVar3,0));
  }
  else {
    iVar4 = 1;
  }
  if (iVar4 == 0) {
    if (in_R8D == 0) {
      printf("PASSED test -- N_VWSqrSumMaskLocal\n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n",(ulong)in_R8D);
    local_28 = 1;
  }
  dVar6 = max_time(in_RDI,dVar1 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar6,"N_VWSqrSumMaskLocal");
  }
  return local_28;
}

Assistant:

int Test_N_VWSqrSumMaskLocal(N_Vector X, N_Vector W, N_Vector ID,
                             sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, xval, wval;

  /* fill vector data */
  xval = SUNRsqrt(myid);
  wval = ONE / SUNRsqrt(local_length - 1);
  set_element_range(X, 0, local_length - 1, xval);
  set_element_range(W, 0, local_length - 1, wval);

  /* use all elements except one */
  N_VConst(ONE, ID);
  set_element(ID, local_length - 1, ZERO);

  start_time = get_time();
  ans        = N_VWSqrSumMaskLocal(X, W, ID);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VWSqrSumMaskLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWSqrSumMaskLocal", maxt);

  return (fails);
}